

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessInfo.cc
# Opt level: O0

CpuTime muduo::ProcessInfo::cpuTime(void)

{
  CpuTime CVar1;
  int iVar2;
  clock_t cVar3;
  double hz;
  tms tms;
  CpuTime t;
  tms local_30;
  CpuTime local_10;
  
  CpuTime::CpuTime(&local_10);
  cVar3 = times(&local_30);
  if (-1 < cVar3) {
    iVar2 = clockTicksPerSecond();
    local_10.userSeconds = (double)local_30.tms_utime / (double)iVar2;
    local_10.systemSeconds = (double)local_30.tms_stime / (double)iVar2;
  }
  CVar1.systemSeconds = local_10.systemSeconds;
  CVar1.userSeconds = local_10.userSeconds;
  return CVar1;
}

Assistant:

ProcessInfo::CpuTime ProcessInfo::cpuTime()
{
  ProcessInfo::CpuTime t;
  struct tms tms;
  if (::times(&tms) >= 0)
  {
    const double hz = static_cast<double>(clockTicksPerSecond());
    t.userSeconds = static_cast<double>(tms.tms_utime) / hz;
    t.systemSeconds = static_cast<double>(tms.tms_stime) / hz;
  }
  return t;
}